

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad-helpers.c
# Opt level: O2

u_int get_figure_of_merit(pcap_if_t *dev)

{
  char *__s1;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *__nptr;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  
  __s1 = dev->name;
  iVar1 = strcmp(__s1,"any");
  if (iVar1 == 0) {
    uVar2 = 0x1fffffff;
  }
  else {
    sVar3 = strlen(__s1);
    pcVar4 = __s1 + (sVar3 - 1);
    do {
      __nptr = pcVar4;
      pcVar4 = __nptr + -1;
      if (pcVar4 < __s1) break;
    } while ((byte)(*pcVar4 - 0x30U) < 10);
    uVar2 = 0;
    if ((byte)(*__nptr - 0x30U) < 10) {
      uVar2 = atoi(__nptr);
    }
  }
  uVar5 = dev->flags << 0x1d;
  uVar6 = ~uVar5;
  return uVar5 & 0x20000000 | uVar2 | uVar6 & 0x80000000 | uVar6 & 0x40000000;
}

Assistant:

static u_int
get_figure_of_merit(pcap_if_t *dev)
{
	const char *cp;
	u_int n;

	if (strcmp(dev->name, "any") == 0) {
		/*
		 * Give the "any" device an artificially high instance
		 * number, so it shows up after all other non-loopback
		 * interfaces.
		 */
		n = 0x1FFFFFFF;	/* 29 all-1 bits */
	} else {
		/*
		 * A number at the end of the device name string is
		 * assumed to be a unit number.
		 */
		cp = dev->name + strlen(dev->name) - 1;
		while (cp-1 >= dev->name && *(cp-1) >= '0' && *(cp-1) <= '9')
			cp--;
		if (*cp >= '0' && *cp <= '9')
			n = atoi(cp);
		else
			n = 0;
	}
	if (!(dev->flags & PCAP_IF_RUNNING))
		n |= 0x80000000;
	if (!(dev->flags & PCAP_IF_UP))
		n |= 0x40000000;
	if (dev->flags & PCAP_IF_LOOPBACK)
		n |= 0x20000000;
	return (n);
}